

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O1

void __thiscall WithBlock::~WithBlock(WithBlock *this)

{
  pointer ppCVar1;
  ulong uVar2;
  
  if (this->pateq != (PatternEquation *)0x0) {
    PatternEquation::release(this->pateq);
  }
  ppCVar1 = (this->contvec).super__Vector_base<ContextChange_*,_std::allocator<ContextChange_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->contvec).super__Vector_base<ContextChange_*,_std::allocator<ContextChange_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar1) {
    uVar2 = 0;
    do {
      if (ppCVar1[uVar2] != (ContextChange *)0x0) {
        (**(code **)(*(long *)ppCVar1[uVar2] + 8))();
      }
      uVar2 = uVar2 + 1;
      ppCVar1 = (this->contvec).
                super__Vector_base<ContextChange_*,_std::allocator<ContextChange_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->contvec).
                                   super__Vector_base<ContextChange_*,_std::allocator<ContextChange_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3))
    ;
  }
  if (ppCVar1 != (pointer)0x0) {
    operator_delete(ppCVar1);
    return;
  }
  return;
}

Assistant:

WithBlock::~WithBlock(void)

{
  if (pateq != (PatternEquation *)0)
    PatternEquation::release(pateq);
  for(int4 i=0;i<contvec.size();++i) {
    delete contvec[i];
  }
}